

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O3

void EdgeDetectionHelper::find
               (EdgeDetectionBase<float> *edgeDetection,Image *image,uint32_t x,uint32_t y,
               uint32_t width,uint32_t height,EdgeParameter *edgeParameter)

{
  EVP_PKEY_CTX *pEVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uchar *__n;
  uint uVar5;
  gradientType gVar6;
  ulong uVar7;
  uint uVar8;
  uchar *sig;
  uint *puVar9;
  EVP_PKEY_CTX *pEVar10;
  uint uVar11;
  ulong uVar12;
  uchar *tbs;
  undefined4 in_register_0000008c;
  size_t tbslen;
  EVP_PKEY_CTX *pEVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  vector<float,_std::allocator<float>_> edgePositive;
  vector<float,_std::allocator<float>_> edgeNegative;
  vector<int,_std::allocator<int>_> secondDerivative;
  vector<int,_std::allocator<int>_> firstDerivative;
  vector<int,_std::allocator<int>_> data;
  vector<float,_std::allocator<float>_> local_c8;
  uchar *local_a8;
  EdgeDetectionBase<float> *local_a0;
  vector<float,_std::allocator<float>_> local_98;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  auVar16 = in_ZMM1._0_16_;
  auVar15 = in_ZMM0._0_16_;
  tbslen = CONCAT44(in_register_0000008c,height);
  __n = (uchar *)(ulong)height;
  uVar14 = (ulong)width;
  pEVar13 = (EVP_PKEY_CTX *)(ulong)x;
  local_a0 = edgeDetection;
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar7 = uVar14;
  pEVar10 = pEVar13;
  tbs = __n;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  EdgeParameter::verify(edgeParameter,pEVar10,sig,uVar7,tbs,tbslen);
  if (edgeParameter->direction < TOP_TO_BOTTOM) {
    height = width;
  }
  if (3 < height) {
    uVar2 = image->_rowSize;
    local_80 = &local_a0->negativeEdgePoint;
    local_a8 = __n;
    if (edgeParameter->direction < TOP_TO_BOTTOM) {
      std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar14,(allocator_type *)&local_60);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,uVar14,(value_type_conflict3 *)&local_78,(allocator_type *)&local_c8);
      local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,uVar14,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_98);
      uVar5 = edgeParameter->groupFactor;
      uVar8 = (int)local_a8 + 1;
      local_a8 = (uchar *)(ulong)uVar8;
      if (uVar8 != uVar5) {
        uVar8 = 0;
        auVar15 = vcvtusi2ss_avx512f(auVar15,(x - 1) + width);
        pEVar13 = pEVar13 + (long)(image->_data + uVar2 * y);
        auVar16 = vcvtusi2ss_avx512f(auVar16,x);
        do {
          if (width != 0) {
            uVar7 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar7] = (uint)(byte)pEVar13[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar14 != uVar7);
            uVar5 = edgeParameter->groupFactor;
          }
          if (1 < uVar5) {
            uVar7 = 1;
            uVar11 = uVar2;
            do {
              if (width != 0) {
                uVar12 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12] =
                       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12] +
                       (uint)(byte)pEVar13[uVar12 + uVar11];
                  uVar12 = uVar12 + 1;
                } while (uVar14 != uVar12);
                uVar5 = edgeParameter->groupFactor;
              }
              uVar7 = uVar7 + 1;
              uVar11 = uVar11 + uVar2;
            } while (uVar7 < uVar5);
          }
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          anon_unknown.dwarf_8d25b::findEdgePoints<float>
                    (&local_c8,&local_98,&local_48,&local_60,&local_78,edgeParameter,
                     edgeParameter->direction == LEFT_TO_RIGHT);
          gVar6 = edgeParameter->gradient;
          if (edgeParameter->direction == LEFT_TO_RIGHT) {
            if ((gVar6 | 2) == ANY) {
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,y + uVar8);
              auVar4 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createPositiveXEdge<float>
                        (&local_c8,&local_a0->positiveEdgePoint,auVar16._0_4_,
                         auVar4._0_4_ * 0.5 + auVar3._0_4_);
              gVar6 = edgeParameter->gradient;
            }
            if (gVar6 - NEGATIVE < 2) {
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,y + uVar8);
              auVar4 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createNegativeXEdge<float>
                        (&local_98,local_80,auVar15._0_4_,auVar4._0_4_ * 0.5 + auVar3._0_4_);
            }
          }
          else {
            if ((gVar6 | 2) == ANY) {
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,y + uVar8);
              auVar4 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createNegativeXEdge<float>
                        (&local_98,&local_a0->positiveEdgePoint,auVar15._0_4_,
                         auVar4._0_4_ * 0.5 + auVar3._0_4_);
              gVar6 = edgeParameter->gradient;
            }
            if (gVar6 - NEGATIVE < 2) {
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,y + uVar8);
              auVar4 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createPositiveXEdge<float>
                        (&local_c8,local_80,auVar16._0_4_,auVar4._0_4_ * 0.5 + auVar3._0_4_);
            }
          }
          if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar5 = edgeParameter->groupFactor;
          uVar8 = uVar8 + edgeParameter->skipFactor;
          pEVar13 = pEVar13 + edgeParameter->skipFactor * uVar2;
        } while (uVar8 < (int)local_a8 - uVar5);
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_48,(size_type)__n,(allocator_type *)&local_60);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,(size_type)__n,(value_type_conflict3 *)&local_78,
                 (allocator_type *)&local_c8);
      local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,(size_type)__n,(value_type_conflict3 *)&local_c8,
                 (allocator_type *)&local_98);
      uVar5 = edgeParameter->groupFactor;
      if (width + 1 != uVar5) {
        uVar14 = (ulong)(uVar2 * (int)local_a8);
        uVar8 = 0;
        auVar15 = vcvtusi2ss_avx512f(auVar15,(y - 1) + (int)local_a8);
        auVar16 = vcvtusi2ss_avx512f(auVar16,y);
        pEVar13 = pEVar13 + (long)(image->_data + uVar2 * y);
        do {
          if (uVar14 != 0) {
            uVar7 = 0;
            puVar9 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
            do {
              pEVar10 = pEVar13 + uVar7;
              uVar7 = uVar7 + uVar2;
              *puVar9 = (uint)(byte)*pEVar10;
              puVar9 = puVar9 + 1;
            } while (uVar14 != uVar7);
            uVar5 = edgeParameter->groupFactor;
          }
          if (1 < uVar5) {
            uVar7 = 1;
            pEVar10 = pEVar13;
            do {
              pEVar10 = pEVar10 + 1;
              if (uVar14 != 0) {
                uVar12 = 0;
                puVar9 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                do {
                  pEVar1 = pEVar10 + uVar12;
                  uVar12 = uVar12 + uVar2;
                  *puVar9 = *puVar9 + (uint)(byte)*pEVar1;
                  puVar9 = puVar9 + 1;
                } while (uVar14 != uVar12);
                uVar5 = edgeParameter->groupFactor;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < uVar5);
          }
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          anon_unknown.dwarf_8d25b::findEdgePoints<float>
                    (&local_c8,&local_98,&local_48,&local_60,&local_78,edgeParameter,
                     edgeParameter->direction == TOP_TO_BOTTOM);
          gVar6 = edgeParameter->gradient;
          if (edgeParameter->direction == TOP_TO_BOTTOM) {
            if ((gVar6 | 2) == ANY) {
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,x + uVar8);
              auVar4 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createPositiveYEdge<float>
                        (&local_c8,&local_a0->positiveEdgePoint,auVar4._0_4_ * 0.5 + auVar3._0_4_,
                         auVar16._0_4_);
              gVar6 = edgeParameter->gradient;
            }
            if (gVar6 - NEGATIVE < 2) {
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,x + uVar8);
              auVar4 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createNegativeYEdge<float>
                        (&local_98,local_80,auVar4._0_4_ * 0.5 + auVar3._0_4_,auVar15._0_4_);
            }
          }
          else {
            if ((gVar6 | 2) == ANY) {
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,x + uVar8);
              auVar4 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createNegativeYEdge<float>
                        (&local_98,&local_a0->positiveEdgePoint,auVar4._0_4_ * 0.5 + auVar3._0_4_,
                         auVar15._0_4_);
              gVar6 = edgeParameter->gradient;
            }
            if (gVar6 - NEGATIVE < 2) {
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,x + uVar8);
              auVar4 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createPositiveYEdge<float>
                        (&local_c8,local_80,auVar4._0_4_ * 0.5 + auVar3._0_4_,auVar16._0_4_);
            }
          }
          if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar5 = edgeParameter->groupFactor;
          uVar8 = uVar8 + edgeParameter->skipFactor;
          pEVar13 = pEVar13 + edgeParameter->skipFactor;
        } while (uVar8 < (width + 1) - uVar5);
      }
    }
    if ((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void EdgeDetectionHelper::find( EdgeDetectionBase<float> & edgeDetection, const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                                const EdgeParameter & edgeParameter )
{
    findEdgePoints( image, x, y, width, height, edgeParameter, edgeDetection.positiveEdgePoint, edgeDetection.negativeEdgePoint );
}